

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# content_encoding.c
# Opt level: O0

CURLcode inflate_stream(Curl_easy *data,contenc_writer *writer,zlibInitState started)

{
  int iVar1;
  contenc_writer *pcVar2;
  bool bVar3;
  int iVar4;
  CURLcode CVar5;
  contenc_writer **strm;
  content_encoding *buf;
  int status;
  char *decomp;
  CURLcode result;
  _Bool done;
  Bytef *orig_in;
  uInt nread;
  z_stream *z;
  zlib_writer *zp;
  zlibInitState started_local;
  contenc_writer *writer_local;
  Curl_easy *data_local;
  
  strm = &writer[1].downstream;
  iVar1 = *(int *)&writer[2].handler;
  pcVar2 = *strm;
  bVar3 = false;
  decomp._0_4_ = CURLE_OK;
  if ((((*(int *)&writer[1].handler == 1) || (*(int *)&writer[1].handler == 2)) ||
      (*(int *)&writer[1].handler == 6)) || (*(int *)&writer[1].handler == 5)) {
    buf = (content_encoding *)(*Curl_cmalloc)(0x4000);
    if (buf == (content_encoding *)0x0) {
      data_local._4_4_ =
           exit_zlib(data,(z_stream *)strm,(zlibInitState *)(writer + 1),CURLE_OUT_OF_MEMORY);
    }
    else {
LAB_00aa8901:
      if (!bVar3) {
        bVar3 = true;
        writer[3].handler = buf;
        *(undefined4 *)&writer[3].downstream = 0x4000;
        iVar4 = cm_zlib_inflate((z_streamp)strm,5);
        if ((*(int *)&writer[3].downstream != 0x4000) && ((iVar4 == 0 || (iVar4 == 1)))) {
          *(zlibInitState *)&writer[1].handler = started;
          decomp._0_4_ = Curl_unencode_write(data,writer->downstream,(char *)buf,
                                             (ulong)(0x4000 - *(int *)&writer[3].downstream));
          if ((CURLcode)decomp != CURLE_OK) {
            exit_zlib(data,(z_stream *)strm,(zlibInitState *)(writer + 1),(CURLcode)decomp);
            goto LAB_00aa8afb;
          }
        }
        switch(iVar4) {
        case 0:
          bVar3 = false;
          break;
        case 1:
          decomp._0_4_ = process_trailer(data,(zlib_writer *)writer);
          break;
        case -5:
          break;
        default:
          CVar5 = process_zlib_error(data,(z_stream *)strm);
          decomp._0_4_ = exit_zlib(data,(z_stream *)strm,(zlibInitState *)(writer + 1),CVar5);
          break;
        case -3:
          if (*(int *)&writer[1].handler == 1) {
            cm_zlib_inflateEnd((z_streamp)strm);
            iVar4 = cm_zlib_inflateInit2_((z_streamp)strm,-0xf,"1.2.12",0x70);
            if (iVar4 == 0) {
              *strm = pcVar2;
              *(int *)&writer[2].handler = iVar1;
              *(undefined4 *)&writer[1].handler = 2;
              *(undefined4 *)((long)&writer[1].handler + 4) = 4;
              bVar3 = false;
              break;
            }
            *(undefined4 *)&writer[1].handler = 0;
          }
          CVar5 = process_zlib_error(data,(z_stream *)strm);
          decomp._0_4_ = exit_zlib(data,(z_stream *)strm,(zlibInitState *)(writer + 1),CVar5);
          break;
        }
        goto LAB_00aa8901;
      }
LAB_00aa8afb:
      (*Curl_cfree)(buf);
      if ((iVar1 != 0) && (*(int *)&writer[1].handler == 1)) {
        *(zlibInitState *)&writer[1].handler = started;
      }
      data_local._4_4_ = (CURLcode)decomp;
    }
  }
  else {
    data_local._4_4_ =
         exit_zlib(data,(z_stream *)strm,(zlibInitState *)(writer + 1),CURLE_WRITE_ERROR);
  }
  return data_local._4_4_;
}

Assistant:

static CURLcode inflate_stream(struct Curl_easy *data,
                               struct contenc_writer *writer,
                               zlibInitState started)
{
  struct zlib_writer *zp = (struct zlib_writer *) writer;
  z_stream *z = &zp->z;         /* zlib state structure */
  uInt nread = z->avail_in;
  Bytef *orig_in = z->next_in;
  bool done = FALSE;
  CURLcode result = CURLE_OK;   /* Curl_client_write status */
  char *decomp;                 /* Put the decompressed data here. */

  /* Check state. */
  if(zp->zlib_init != ZLIB_INIT &&
     zp->zlib_init != ZLIB_INFLATING &&
     zp->zlib_init != ZLIB_INIT_GZIP &&
     zp->zlib_init != ZLIB_GZIP_INFLATING)
    return exit_zlib(data, z, &zp->zlib_init, CURLE_WRITE_ERROR);

  /* Dynamically allocate a buffer for decompression because it's uncommonly
     large to hold on the stack */
  decomp = malloc(DSIZ);
  if(!decomp)
    return exit_zlib(data, z, &zp->zlib_init, CURLE_OUT_OF_MEMORY);

  /* because the buffer size is fixed, iteratively decompress and transfer to
     the client via downstream_write function. */
  while(!done) {
    int status;                   /* zlib status */
    done = TRUE;

    /* (re)set buffer for decompressed output for every iteration */
    z->next_out = (Bytef *) decomp;
    z->avail_out = DSIZ;

#ifdef Z_BLOCK
    /* Z_BLOCK is only available in zlib ver. >= 1.2.0.5 */
    status = inflate(z, Z_BLOCK);
#else
    /* fallback for zlib ver. < 1.2.0.5 */
    status = inflate(z, Z_SYNC_FLUSH);
#endif

    /* Flush output data if some. */
    if(z->avail_out != DSIZ) {
      if(status == Z_OK || status == Z_STREAM_END) {
        zp->zlib_init = started;      /* Data started. */
        result = Curl_unencode_write(data, writer->downstream, decomp,
                                     DSIZ - z->avail_out);
        if(result) {
          exit_zlib(data, z, &zp->zlib_init, result);
          break;
        }
      }
    }

    /* Dispatch by inflate() status. */
    switch(status) {
    case Z_OK:
      /* Always loop: there may be unflushed latched data in zlib state. */
      done = FALSE;
      break;
    case Z_BUF_ERROR:
      /* No more data to flush: just exit loop. */
      break;
    case Z_STREAM_END:
      result = process_trailer(data, zp);
      break;
    case Z_DATA_ERROR:
      /* some servers seem to not generate zlib headers, so this is an attempt
         to fix and continue anyway */
      if(zp->zlib_init == ZLIB_INIT) {
        /* Do not use inflateReset2(): only available since zlib 1.2.3.4. */
        (void) inflateEnd(z);     /* don't care about the return code */
        if(inflateInit2(z, -MAX_WBITS) == Z_OK) {
          z->next_in = orig_in;
          z->avail_in = nread;
          zp->zlib_init = ZLIB_INFLATING;
          zp->trailerlen = 4; /* Tolerate up to 4 unknown trailer bytes. */
          done = FALSE;
          break;
        }
        zp->zlib_init = ZLIB_UNINIT;    /* inflateEnd() already called. */
      }
      result = exit_zlib(data, z, &zp->zlib_init, process_zlib_error(data, z));
      break;
    default:
      result = exit_zlib(data, z, &zp->zlib_init, process_zlib_error(data, z));
      break;
    }
  }
  free(decomp);

  /* We're about to leave this call so the `nread' data bytes won't be seen
     again. If we are in a state that would wrongly allow restart in raw mode
     at the next call, assume output has already started. */
  if(nread && zp->zlib_init == ZLIB_INIT)
    zp->zlib_init = started;      /* Cannot restart anymore. */

  return result;
}